

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

void __thiscall
JsrtExternalType::JsrtExternalType
          (JsrtExternalType *this,ScriptContext *scriptContext,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype)

{
  JavascriptLibrary *this_00;
  TypePath *typePath;
  DynamicTypeHandler *typeHandler;
  RecyclableObject *prototype_local;
  JsFinalizeCallback finalizeCallback_local;
  ScriptContext *scriptContext_local;
  JsrtExternalType *this_local;
  
  this_00 = Js::ScriptContext::GetLibrary(scriptContext);
  typePath = Js::JavascriptLibrary::GetRootPath(this_00);
  typeHandler = (DynamicTypeHandler *)
                Js::PathTypeHandlerNoAttr::New
                          (scriptContext,typePath,0,0,0,true,true,(DynamicType *)0x0);
  Js::DynamicType::DynamicType
            (&this->super_DynamicType,scriptContext,TypeIds_Object,prototype,(JavascriptMethod)0x0,
             typeHandler,true,true);
  this->jsFinalizeCallback = finalizeCallback;
  this->jsTraceCallback = (Type)0x0;
  operator|=(&(this->super_DynamicType).super_Type.flags,TypeFlagMask_JsrtExternal);
  return;
}

Assistant:

JsrtExternalType::JsrtExternalType(Js::ScriptContext* scriptContext, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype)
    : Js::DynamicType(
        scriptContext,
        Js::TypeIds_Object,
        prototype,
        nullptr,
        Js::PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, 0, 0, true, true),
        true,
        true)
#ifdef _CHAKRACOREBUILD
    , jsTraceCallback(nullptr)
#endif
    , jsFinalizeCallback(finalizeCallback)
{
    this->flags |= TypeFlagMask_JsrtExternal;
}